

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_long>::__encodeArray
          (FastPForImpl<4U,_unsigned_long> *this,unsigned_long *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  undefined8 *puVar1;
  iterator __position;
  pointer __src;
  pointer pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  unsigned_long *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint32_t k_1;
  uint bit;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  FastPForImpl<4U,_unsigned_long> *pFVar9;
  uint32_t *puVar10;
  uint uVar11;
  byte *pbVar12;
  uint32_t k;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  uint8_t bestb;
  uint8_t maxb;
  uint8_t bestcexcept;
  byte local_63;
  byte local_62;
  byte local_61;
  unsigned_long *local_60;
  uint32_t *local_58;
  FastPForImpl<4U,_unsigned_long> *local_50;
  size_t *local_48;
  unsigned_long *local_40;
  ulong local_38;
  undefined1 auVar16 [16];
  undefined1 auVar28 [64];
  
  local_58 = out;
  local_48 = nvalue;
  checkifdivisibleby(length,0x80);
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  lVar7 = 0x48;
  auVar19 = vpbroadcastq_avx512f(ZEXT816(0x41));
  auVar20 = vpbroadcastq_avx512f();
  do {
    uVar13 = vpcmpuq_avx512f(auVar18,auVar19,1);
    auVar21._8_8_ = 0x18;
    auVar21._0_8_ = 0x18;
    auVar21._16_8_ = 0x18;
    auVar21._24_8_ = 0x18;
    auVar21._32_8_ = 0x18;
    auVar21._40_8_ = 0x18;
    auVar21._48_8_ = 0x18;
    auVar21._56_8_ = 0x18;
    auVar21 = vpmullq_avx512dq(auVar18,auVar21);
    auVar21 = vpaddq_avx512f(auVar20,auVar21);
    auVar22 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(((this->datatobepacked).
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data + length));
    auVar16._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar22._8_8_;
    auVar16._0_8_ = (ulong)((byte)uVar13 & 1) * auVar22._0_8_;
    auVar23._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar22._16_8_;
    auVar23._0_16_ = auVar16;
    auVar23._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar22._24_8_;
    auVar23._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar22._32_8_;
    auVar23._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar22._40_8_;
    auVar23._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar22._48_8_;
    auVar23._56_8_ = (uVar13 >> 7) * auVar22._56_8_;
    auVar22 = vpgatherqq_avx512f(_DAT_00000008);
    auVar24._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar22._8_8_;
    auVar24._0_8_ = (ulong)((byte)uVar13 & 1) * auVar22._0_8_;
    auVar24._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar22._16_8_;
    auVar24._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar22._24_8_;
    auVar24._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar22._32_8_;
    auVar24._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar22._40_8_;
    auVar24._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar22._48_8_;
    auVar24._56_8_ = (uVar13 >> 7) * auVar22._56_8_;
    uVar6 = vpcmpq_avx512f(auVar24,auVar23,4);
    vpscatterqq_avx512f(ZEXT864(8) + auVar21,uVar13 & uVar6,auVar23);
    auVar22._8_8_ = 8;
    auVar22._0_8_ = 8;
    auVar22._16_8_ = 8;
    auVar22._24_8_ = 8;
    auVar22._32_8_ = 8;
    auVar22._40_8_ = 8;
    auVar22._48_8_ = 8;
    auVar22._56_8_ = 8;
    auVar18 = vpaddq_avx512f(auVar18,auVar22);
    lVar7 = lVar7 + -8;
  } while (lVar7 != 0);
  puVar10 = local_58 + 1;
  pbVar12 = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_50 = this;
  if (0x7f < (long)length) {
    local_40 = in + length;
    puVar5 = in + 0x80;
    do {
      pFVar9 = local_50;
      nvalue = (size_t *)&local_62;
      auVar23 = ZEXT1664(auVar23._0_16_);
      local_60 = puVar5;
      getBestBFromData(local_50,in,&local_63,&local_61,(uint8_t *)nvalue);
      *pbVar12 = local_63;
      pbVar12[1] = local_61;
      if (local_61 == 0) {
        pbVar12 = pbVar12 + 2;
      }
      else {
        pbVar12[2] = local_62;
        pbVar12 = pbVar12 + 3;
        uVar6 = (ulong)local_63;
        this_00 = (pFVar9->datatobepacked).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (local_62 - uVar6);
        lVar7 = 0;
        do {
          if (in[lVar7] >> (uVar6 & 0x3f) != 0) {
            local_38 = in[lVar7] >> ((ulong)local_63 & 0x3f);
            __position._M_current =
                 (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(this_00,__position,&local_38);
            }
            else {
              *__position._M_current = local_38;
              (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            *pbVar12 = (byte)lVar7;
            pbVar12 = pbVar12 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x80);
      }
      bit = (uint)local_63;
      uVar11 = (uint)local_63;
      lVar7 = 0;
      do {
        fastpack((uint64_t *)((long)in + lVar7),puVar10,bit);
        auVar16 = auVar23._0_16_;
        lVar7 = lVar7 + 0x100;
        puVar10 = (uint32_t *)((long)puVar10 + (ulong)(uVar11 * 4));
      } while (lVar7 != 0x400);
      puVar5 = local_60 + 0x80;
      in = in + 0x80;
    } while (puVar5 <= local_40);
  }
  pFVar9 = local_50;
  *local_58 = (uint32_t)((ulong)((long)puVar10 - (long)local_58) >> 2);
  __src = (local_50->bytescontainer).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  uVar11 = (int)pbVar12 - (int)__src;
  *puVar10 = uVar11;
  uVar6 = (ulong)uVar11;
  auVar18 = ZEXT1664(auVar16);
  memcpy(puVar10 + 1,__src,uVar6);
  uVar13 = uVar6 + 3 & 0xfffffffffffffffc;
  if (uVar6 < uVar13) {
    uVar15 = uVar6 + 5 + (long)puVar10;
    uVar8 = uVar13 + 4 + (long)puVar10;
    if (uVar8 < uVar15) {
      uVar8 = uVar15;
    }
    memset((void *)((long)(puVar10 + 1) + uVar6),0,(uVar8 - (uVar6 + (long)puVar10)) - 4);
  }
  puVar1 = (undefined8 *)((long)puVar10 + uVar13 + 4);
  pvVar2 = (pFVar9->datatobepacked).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
  lVar7 = 0;
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar21 = vpbroadcastq_avx512f(ZEXT816(0x3f));
  auVar22 = vpternlogd_avx512f(auVar18,auVar18,auVar18,0xff);
  auVar23 = vpbroadcastq_avx512f(ZEXT816(1));
  auVar24 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar26 = vmovdqa64_avx512f(auVar18);
    auVar27 = vpbroadcastq_avx512f();
    auVar27 = vporq_avx512f(auVar27,auVar20);
    uVar6 = vpcmpuq_avx512f(auVar27,auVar21,1);
    vpmullq_avx512dq(auVar19,auVar24);
    auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)((long)&(pvVar2->
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 )._M_impl.super__Vector_impl_data + 8U) +
                                  (long)nvalue));
    auVar29._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar28._8_8_;
    auVar29._0_8_ = (ulong)((byte)uVar6 & 1) * auVar28._0_8_;
    auVar29._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar28._16_8_;
    auVar29._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar28._24_8_;
    auVar29._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar28._32_8_;
    auVar29._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar28._40_8_;
    auVar29._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar28._48_8_;
    auVar29._56_8_ = (uVar6 >> 7) * auVar28._56_8_;
    auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar2->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data + (long)nvalue));
    auVar30._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar28._8_8_;
    auVar30._0_8_ = (ulong)((byte)uVar6 & 1) * auVar28._0_8_;
    auVar30._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar28._16_8_;
    auVar30._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar28._24_8_;
    auVar30._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar28._32_8_;
    auVar30._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar28._40_8_;
    auVar30._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar28._48_8_;
    auVar30._56_8_ = (uVar6 >> 7) * auVar28._56_8_;
    uVar6 = vpcmpq_avx512f(auVar29,auVar30,4);
    auVar28 = vpaddq_avx512f(auVar19,auVar22);
    auVar28 = vpsllvq_avx512f(auVar23,auVar28);
    auVar28 = vporq_avx512f(auVar18,auVar28);
    bVar3 = (bool)((byte)uVar6 & 1);
    auVar31._0_8_ = (ulong)bVar3 * auVar28._0_8_ | (ulong)!bVar3 * auVar18._0_8_;
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar31._8_8_ = (ulong)bVar3 * auVar28._8_8_ | (ulong)!bVar3 * auVar18._8_8_;
    bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar31._16_8_ = (ulong)bVar3 * auVar28._16_8_ | (ulong)!bVar3 * auVar18._16_8_;
    bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar31._24_8_ = (ulong)bVar3 * auVar28._24_8_ | (ulong)!bVar3 * auVar18._24_8_;
    bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar31._32_8_ = (ulong)bVar3 * auVar28._32_8_ | (ulong)!bVar3 * auVar18._32_8_;
    bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar31._40_8_ = (ulong)bVar3 * auVar28._40_8_ | (ulong)!bVar3 * auVar18._40_8_;
    bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar31._48_8_ = (ulong)bVar3 * auVar28._48_8_ | (ulong)!bVar3 * auVar18._48_8_;
    auVar31._56_8_ = (uVar6 >> 7) * auVar28._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar18._56_8_;
    lVar7 = lVar7 + 8;
    auVar19 = vpaddq_avx512f(auVar19,auVar25);
    auVar18 = auVar31;
  } while (lVar7 != 0x40);
  auVar18._8_8_ = 0x3f;
  auVar18._0_8_ = 0x3f;
  auVar18._16_8_ = 0x3f;
  auVar18._24_8_ = 0x3f;
  auVar18._32_8_ = 0x3f;
  auVar18._40_8_ = 0x3f;
  auVar18._48_8_ = 0x3f;
  auVar18._56_8_ = 0x3f;
  uVar6 = vpcmpuq_avx512f(auVar27,auVar18,1);
  auVar18 = vmovdqa64_avx512f(auVar31);
  bVar3 = (bool)((byte)uVar6 & 1);
  auVar19._0_8_ = (ulong)bVar3 * auVar18._0_8_ | (ulong)!bVar3 * auVar26._0_8_;
  bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar19._8_8_ = (ulong)bVar3 * auVar18._8_8_ | (ulong)!bVar3 * auVar26._8_8_;
  bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar19._16_8_ = (ulong)bVar3 * auVar18._16_8_ | (ulong)!bVar3 * auVar26._16_8_;
  bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar19._24_8_ = (ulong)bVar3 * auVar18._24_8_ | (ulong)!bVar3 * auVar26._24_8_;
  bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
  auVar19._32_8_ = (ulong)bVar3 * auVar18._32_8_ | (ulong)!bVar3 * auVar26._32_8_;
  bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
  auVar19._40_8_ = (ulong)bVar3 * auVar18._40_8_ | (ulong)!bVar3 * auVar26._40_8_;
  bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
  auVar19._48_8_ = (ulong)bVar3 * auVar18._48_8_ | (ulong)!bVar3 * auVar26._48_8_;
  auVar19._56_8_ = (uVar6 >> 7) * auVar18._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar26._56_8_;
  auVar17 = vextracti64x4_avx512f(auVar19,1);
  auVar18 = vporq_avx512f(auVar19,ZEXT3264(auVar17));
  auVar16 = vpor_avx(auVar18._0_16_,auVar18._16_16_);
  auVar4 = vpshufd_avx(auVar16,0xee);
  auVar16 = vpor_avx(auVar16,auVar4);
  *puVar1 = auVar16._0_8_;
  puVar10 = (uint32_t *)(puVar1 + 1);
  lVar7 = 2;
  local_60 = (unsigned_long *)0x8;
  do {
    pvVar2 = (pFVar9->datatobepacked).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)*(pointer *)
                    ((long)&pvVar2[lVar7].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8) -
             *(long *)&pvVar2[lVar7].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data;
    if (lVar14 != 0) {
      uVar15 = lVar14 >> 3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar2 + lVar7,uVar15 + 0x1f & 0xffffffffffffffe0);
      lVar14 = *(long *)&(pFVar9->datatobepacked).
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar7].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data;
      *puVar10 = (uint32_t)uVar15;
      puVar10 = puVar10 + 1;
      uVar11 = 0;
      uVar6 = 0;
      uVar13 = 0x20;
      do {
        fastpackwithoutmask((uint64_t *)(lVar14 + uVar6 * 8),puVar10,(uint32_t)lVar7);
        uVar11 = uVar11 + 0x20;
        puVar10 = (uint32_t *)((long)puVar10 + (long)local_60);
        bVar3 = uVar13 < uVar15;
        uVar6 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 0x20);
      } while (bVar3);
      puVar10 = puVar10 + -((uVar11 - uVar15) * lVar7 >> 5);
      pFVar9 = local_50;
    }
    lVar7 = lVar7 + 1;
    local_60 = (unsigned_long *)((long)local_60 + 4);
  } while (lVar7 != 0x41);
  *local_48 = (long)puVar10 - (long)local_58 >> 2;
  return;
}

Assistant:

void __encodeArray(const IntType *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out;  // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++;  // keep track of this
    for (uint32_t k = 0; k < sizeof(IntType) * 8 + 1; ++k) {
      datatobepacked[k].clear();
    }
    uint8_t *bc = &bytescontainer[0];
    for (const IntType *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<IntType> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const IntType maxval = static_cast<IntType>(1ULL << bestb);
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    IntType bitmap = 0;
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() != 0) bitmap |= (1ULL << (k - 1));
    }
    *(reinterpret_cast<IntType *>(out)) = bitmap;
    out += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);

    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() > 0) {
        size_t nValue = datatobepacked[k].size();
        datatobepacked[k].resize((datatobepacked[k].size() + 32 - 1) / 32 * 32);
        out = packingvector<32>::packmeuptightwithoutmask(
            datatobepacked[k].data(), nValue, out, k);
      }
    }
    nvalue = out - initout;
  }